

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_value<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  value_type *pvVar3;
  value_t ty;
  context<toml::type_config> *in_stack_000000f8;
  location *in_stack_00000100;
  context<toml::type_config> *in_stack_000001c8;
  location *in_stack_000001d0;
  context<toml::type_config> *in_stack_00000e60;
  location *in_stack_00000e68;
  location *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  value_type vVar4;
  undefined1 uVar5;
  result<toml::value_t,_toml::error_info> *in_stack_ffffffffffffff88;
  location *in_stack_ffffffffffffff90;
  
  guess_value_type<toml::type_config>(in_stack_00000e68,in_stack_00000e60);
  uVar5 = 0;
  pvVar3 = result<toml::value_t,_toml::error_info>::unwrap_or
                     (in_stack_ffffffffffffff88,
                      (value_type *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80));
  vVar4 = *pvVar3;
  result<toml::value_t,_toml::error_info>::~result
            ((result<toml::value_t,_toml::error_info> *)0x6aa4ff);
  if (vVar4 == string) {
    skip_string_like<toml::type_config>(in_stack_000001d0,in_stack_000001c8);
  }
  else if (vVar4 == array) {
    skip_array_like<toml::type_config>(in_stack_00000100,in_stack_000000f8);
  }
  else if (vVar4 == table) {
    skip_inline_table_like<toml::type_config>(in_stack_00000100,in_stack_000000f8);
  }
  else {
    while ((((bVar1 = location::eof((location *)
                                    CONCAT17(uVar5,CONCAT16(vVar4,in_stack_ffffffffffffff80))),
             ((bVar1 ^ 0xffU) & 1) != 0 &&
             (cVar2 = location::current(in_stack_ffffffffffffff78), cVar2 != '\n')) &&
            (cVar2 = location::current(in_stack_ffffffffffffff78), cVar2 != ',')) &&
           ((cVar2 = location::current(in_stack_ffffffffffffff78), cVar2 != ']' &&
            (cVar2 = location::current(in_stack_ffffffffffffff78), cVar2 != '}'))))) {
      location::advance(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void skip_value(location& loc, const context<TC>& ctx)
{
    value_t ty = guess_value_type(loc, ctx).unwrap_or(value_t::empty);
    if(ty == value_t::string)
    {
        skip_string_like(loc, ctx);
    }
    else if(ty == value_t::array)
    {
        skip_array_like(loc, ctx);
    }
    else if(ty == value_t::table)
    {
        // In case of multiline tables, it may skip key-value pair but not the
        // whole table.
        skip_inline_table_like(loc, ctx);
    }
    else // others are an "in-line" values. skip until the next line
    {
        while( ! loc.eof())
        {
            if(loc.current() == '\n')
            {
                break;
            }
            else if(loc.current() == ',' || loc.current() == ']' || loc.current() == '}')
            {
                break;
            }
            loc.advance();
        }
    }
    return;
}